

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

XmlRpcValue __thiscall miniros::Subscription::getStats(Subscription *this)

{
  long lVar1;
  Subscription *pSVar2;
  XmlRpcValue *pXVar3;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  long in_RSI;
  long *plVar4;
  XmlRpcValue XVar5;
  int local_54;
  pthread_mutex_t *local_50;
  Subscription *local_48;
  XmlRpcValue conn_data;
  
  *(undefined4 *)&this->_vptr_Subscription = 0;
  (this->super_enable_shared_from_this<miniros::Subscription>)._M_weak_this.
  super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  XmlRpc::XmlRpcValue::XmlRpcValue(&conn_data,(string *)(in_RSI + 0x18));
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&conn_data);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&conn_data);
  conn_data._type = TypeInvalid;
  conn_data._value.asDouble = 0.0;
  XmlRpc::XmlRpcValue::assertArray(&conn_data,0);
  local_50 = (pthread_mutex_t *)(in_RSI + 0x180);
  local_48 = this;
  std::mutex::lock((mutex *)&local_50->__data);
  for (plVar4 = *(long **)(in_RSI + 0x168); pSVar2 = local_48, plVar4 != *(long **)(in_RSI + 0x170);
      plVar4 = plVar4 + 2) {
    lVar1 = *plVar4;
    local_54 = *(int *)(lVar1 + 0x28);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,0);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,0);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = *(int *)(lVar1 + 0x50);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,0);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,1);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = *(int *)(lVar1 + 0x58);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,0);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,2);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = *(int *)(lVar1 + 0x60);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,0);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,3);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
    local_54 = 0;
    pXVar3 = XmlRpc::XmlRpcValue::operator[](&conn_data,0);
    pXVar3 = XmlRpc::XmlRpcValue::operator[](pXVar3,4);
    XmlRpc::XmlRpcValue::operator=(pXVar3,&local_54);
  }
  pXVar3 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)local_48,1);
  XmlRpc::XmlRpcValue::operator=(pXVar3,&conn_data);
  pthread_mutex_unlock(local_50);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&conn_data);
  XVar5._value.asDouble = extraout_RDX.asDouble;
  XVar5._0_8_ = pSVar2;
  return XVar5;
}

Assistant:

XmlRpcValue Subscription::getStats()
{
  XmlRpcValue stats;
  stats[0] = name_;
  XmlRpcValue conn_data;
  conn_data.setSize(0);

  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  uint32_t cidx = 0;
  for (V_PublisherLink::iterator c = publisher_links_.begin();
       c != publisher_links_.end(); ++c)
  {
    const PublisherLink::Stats& s = (*c)->getStats();
    conn_data[cidx][0] = (*c)->getConnectionID();
    conn_data[cidx][1] = (int)s.bytes_received_;
    conn_data[cidx][2] = (int)s.messages_received_;
    conn_data[cidx][3] = (int)s.drops_;
    conn_data[cidx][4] = 0; // figure out something for this. not sure.
  }

  stats[1] = conn_data;
  return stats;
}